

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::edgeIsLeftOfEdge
          (SimpleToMonotone *this,int leftEdgeIndex,int rightEdgeIndex)

{
  int iVar1;
  Edge *this_00;
  Edge *this_01;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  qint64 d;
  QPodPoint *l;
  QPodPoint *u;
  Edge *rightEdge;
  Edge *leftEdge;
  QPodPoint *in_stack_ffffffffffffff98;
  QPodPoint *in_stack_ffffffffffffffa0;
  QDataBuffer<QPodPoint> *pQVar2;
  QDataBuffer<QPodPoint> *this_02;
  long local_38;
  
  this_00 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                      ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                       (in_RDI + 3),(long)in_ESI);
  this_01 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                      ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                       (in_RDI + 3),(long)in_EDX);
  this_02 = (QDataBuffer<QPodPoint> *)*in_RDI;
  iVar1 = Edge::upper(this_01);
  QDataBuffer<QPodPoint>::at(this_02,(long)iVar1);
  pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
  iVar1 = Edge::lower(this_01);
  QDataBuffer<QPodPoint>::at(pQVar2,(long)iVar1);
  pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
  iVar1 = Edge::upper(this_00);
  QDataBuffer<QPodPoint>::at(pQVar2,(long)iVar1);
  local_38 = qPointDistanceFromLine
                       ((QPodPoint *)this_02,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_38 == 0) {
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    iVar1 = Edge::lower(this_00);
    QDataBuffer<QPodPoint>::at(pQVar2,(long)iVar1);
    local_38 = qPointDistanceFromLine
                         ((QPodPoint *)this_02,(QPodPoint *)pQVar2,in_stack_ffffffffffffff98);
  }
  return local_38 < 0;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::edgeIsLeftOfEdge(int leftEdgeIndex, int rightEdgeIndex) const
{
    const Edge &leftEdge = m_edges.at(leftEdgeIndex);
    const Edge &rightEdge = m_edges.at(rightEdgeIndex);
    const QPodPoint &u = m_parent->m_vertices.at(rightEdge.upper());
    const QPodPoint &l = m_parent->m_vertices.at(rightEdge.lower());
    qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.upper()), l, u);
    // d < 0: left, d > 0: right, d == 0: on top
    if (d == 0)
        d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.lower()), l, u);
    return d < 0;
}